

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::Int64Option::printOptions(Int64Option *this,FILE *pcsFile,int granularity)

{
  char *pcVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  int in_EDX;
  FILE *in_RSI;
  long *in_RDI;
  int64_t i_1;
  size_t i;
  vector<long,_std::allocator<long>_> values;
  vector<long,_std::allocator<long>_> *this_00;
  long local_50;
  ulong local_48;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffe0;
  FILE *__stream;
  
  pcVar1 = strstr((char *)in_RDI[1],"debug");
  if (((pcVar1 == (char *)0x0) &&
      (pcVar1 = strstr((char *)in_RDI[2],"debug"), pcVar1 == (char *)0x0)) &&
     (uVar2 = (**(code **)(*in_RDI + 0x50))(), (uVar2 & 1) != 0)) {
    if (in_EDX == 0) {
      if ((((in_RDI[7] - in_RDI[6] < 0x11) && (0 < in_RDI[7] - in_RDI[6])) &&
          (in_RDI[7] != 0x7fffffff)) || ((in_RDI[6] < 1 && (-1 < in_RDI[7])))) {
        if ((in_RDI[7] - in_RDI[6] < 0x11) && (0 < in_RDI[7] - in_RDI[6])) {
          fprintf(in_RSI,"%s  {%ld",in_RDI[1],in_RDI[6]);
          local_50 = in_RDI[6];
          while (local_50 = local_50 + 1, local_50 <= in_RDI[7]) {
            fprintf(in_RSI,",%ld",local_50);
          }
          fprintf(in_RSI,"} [%ld]    # %s\n",in_RDI[8],in_RDI[2]);
        }
        else {
          fprintf(in_RSI,"%s  [%ld,%ld] [%ld]i    # %s\n",in_RDI[1],in_RDI[6],in_RDI[7],in_RDI[8],
                  in_RDI[2]);
        }
      }
      else {
        fprintf(in_RSI,"%s  [%ld,%ld] [%ld]il   # %s\n",in_RDI[1],in_RDI[6],in_RDI[7],in_RDI[8],
                in_RDI[2]);
      }
    }
    else {
      fprintf(in_RSI,"%s  {",in_RDI[1]);
      this_00 = (vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0;
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)0x14b6ac);
      fillGranularityDomain((Int64Option *)in_RSI,in_EDX,in_stack_ffffffffffffffe0);
      for (local_48 = 0;
          sVar3 = std::vector<long,_std::allocator<long>_>::size
                            ((vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0),
          local_48 < sVar3; local_48 = local_48 + 1) {
        __stream = in_RSI;
        if (local_48 != 0) {
          fprintf(in_RSI,",");
          __stream = in_RSI;
        }
        in_RSI = __stream;
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0,local_48
                           );
        fprintf(__stream,"%ld",*pvVar4);
      }
      fprintf(in_RSI,"} [%ld]    # %s\n",in_RDI[8],in_RDI[2]);
      std::vector<long,_std::allocator<long>_>::~vector(this_00);
    }
  }
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {

        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        // print only, if there is a default
        // choose between logarithmic scale and linear scale based on the number of elements in the list - more than 16 elements means it should be log (simple heuristic)

        if (granularity != 0) {
            fprintf(pcsFile, "%s  {", name);
            std::vector<int64_t> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (i != 0) {
                    fprintf(pcsFile, ",");
                }
                fprintf(pcsFile, "%ld", values[i]);
            }
            fprintf(pcsFile, "} [%ld]    # %s\n", value, description);
        } else {
            if ((range.end - range.begin <= 16 && range.end - range.begin > 0 && range.end != INT32_MAX) ||
                (range.begin <= 0 && range.end >= 0)) {
                if (range.end - range.begin <= 16 && range.end - range.begin > 0) { // print all values if the difference is really small
                    fprintf(pcsFile, "%s  {%ld", name, range.begin);
                    for (int64_t i = range.begin + 1; i <= range.end; ++i) {
                        fprintf(pcsFile, ",%ld", i);
                    }
                    fprintf(pcsFile, "} [%ld]    # %s\n", value, description);
                } else {
                    fprintf(pcsFile, "%s  [%ld,%ld] [%ld]i    # %s\n", name, range.begin, range.end, value, description);
                }
            } else {
                fprintf(pcsFile, "%s  [%ld,%ld] [%ld]il   # %s\n", name, range.begin, range.end, value, description);
            }
        }
    }